

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseScript
          (WastParser *this,unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script
          )

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result result;
  TokenTypePair pair;
  pointer pMVar2;
  pointer pSVar3;
  pointer commands;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f4;
  undefined1 local_f3;
  allocator local_f2;
  allocator local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8 [32];
  iterator local_a8;
  size_type local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  Enum local_7c;
  _Type local_78;
  uint local_70;
  Enum local_6c;
  Location local_68;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> local_48;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> command;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> local_28;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> script;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script_local;
  WastParser *this_local;
  
  script._M_t.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
  super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true>)
       (__uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true>)out_script;
  MakeUnique<wabt::Script>();
  pair = PeekPair(this);
  bVar1 = anon_unknown_1::IsModuleField(pair);
  if (bVar1) {
    MakeUnique<wabt::ModuleCommand>();
    GetLocation(&local_68,this);
    pMVar2 = std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::
             operator->(&local_48);
    (pMVar2->module).loc.filename.data_ = local_68.filename.data_;
    (pMVar2->module).loc.filename.size_ = local_68.filename.size_;
    (pMVar2->module).loc.field_1.field_1.offset = (size_t)local_68.field_1.field_1.offset;
    *(undefined8 *)((long)&(pMVar2->module).loc.field_1 + 8) = local_68.field_1._8_8_;
    pMVar2 = std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::
             operator->(&local_48);
    local_6c = (Enum)ParseModuleFieldList(this,&pMVar2->module);
    bVar1 = Failed((Result)local_6c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      pSVar3 = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::operator->
                         (&local_28);
      std::
      vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
      ::emplace_back<std::unique_ptr<wabt::ModuleCommand,std::default_delete<wabt::ModuleCommand>>>
                ((vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
                  *)pSVar3,&local_48);
    }
    local_70 = (uint)bVar1;
    std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::~unique_ptr
              (&local_48);
    if (local_70 != 0) goto LAB_016d6e58;
  }
  else {
    local_78 = (_Type)PeekPair(this);
    bVar1 = anon_unknown_1::IsCommand((TokenTypePair)local_78);
    if (bVar1) {
      pSVar3 = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::get(&local_28);
      commands = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::operator->
                           (&local_28);
      local_7c = (Enum)ParseCommandList(this,pSVar3,&commands->commands);
      bVar1 = Failed((Result)local_7c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_70 = 1;
        goto LAB_016d6e58;
      }
    }
    else {
      ConsumeIfLpar(this);
      local_f3 = 1;
      local_f0 = &local_e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,"a module field",&local_f1);
      local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"a command",&local_f2);
      local_f3 = 0;
      local_a8 = &local_e8;
      local_a0 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_f4);
      __l._M_len = local_a0;
      __l._M_array = local_a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_98,__l,&local_f4);
      ErrorExpected(this,&local_98,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_f4);
      local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8;
      do {
        local_180 = local_180 + -1;
        std::__cxx11::string::~string((string *)local_180);
      } while (local_180 != &local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f2);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
  }
  result = Expect(this,Eof);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    local_70 = 1;
  }
  else {
    sVar4 = std::vector<wabt::Error,_std::allocator<wabt::Error>_>::size(this->errors_);
    if (sVar4 == 0) {
      std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::operator=
                ((unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)
                 script._M_t.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>
                 ._M_t.super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                 super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,&local_28);
      Result::Result((Result *)((long)&this_local + 4),Ok);
      local_70 = 1;
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
  }
LAB_016d6e58:
  std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::~unique_ptr(&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseScript(std::unique_ptr<Script>* out_script) {
  WABT_TRACE(ParseScript);
  auto script = MakeUnique<Script>();

  // Don't consume the Lpar yet, even though it is required. This way the
  // sub-parser functions (e.g. ParseFuncModuleField) can consume it and keep
  // the parsing structure more regular.
  if (IsModuleField(PeekPair())) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    auto command = MakeUnique<ModuleCommand>();
    command->module.loc = GetLocation();
    CHECK_RESULT(ParseModuleFieldList(&command->module));
    script->commands.emplace_back(std::move(command));
  } else if (IsCommand(PeekPair())) {
    CHECK_RESULT(ParseCommandList(script.get(), &script->commands));
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a command"});
  }

  EXPECT(Eof);
  if (errors_->size() == 0) {
    *out_script = std::move(script);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}